

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

OptionType __thiscall
args::ArgumentParser::ParseOption(ArgumentParser *this,string *s,bool allowEmpty)

{
  long lVar1;
  OptionType OVar2;
  
  OVar2 = LongFlag;
  lVar1 = std::__cxx11::string::find((string *)s,(ulong)&this->longprefix);
  if (((lVar1 != 0) ||
      ((!allowEmpty && (s->_M_string_length <= (this->longprefix)._M_string_length)))) &&
     ((lVar1 = std::__cxx11::string::find((string *)s,(ulong)&this->shortprefix), lVar1 != 0 ||
      ((OVar2 = ShortFlag, !allowEmpty &&
       (s->_M_string_length <= (this->shortprefix)._M_string_length)))))) {
    OVar2 = Positional;
  }
  return OVar2;
}

Assistant:

OptionType ParseOption(const std::string &s, bool allowEmpty = false)
            {
                if (s.find(longprefix) == 0 && (allowEmpty || s.length() > longprefix.length()))
                {
                    return OptionType::LongFlag;
                }

                if (s.find(shortprefix) == 0 && (allowEmpty || s.length() > shortprefix.length()))
                {
                    return OptionType::ShortFlag;
                }

                return OptionType::Positional;
            }